

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

trie_node * trie_lookup(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint *lvl)

{
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  _Bool _Var1;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff84;
  uint *lvl_local;
  uint8_t mask_len_local;
  lrtr_ip_addr *prefix_local;
  trie_node *root_local;
  lrtr_ip_addr local_40;
  lrtr_ip_addr local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  prefix_local = &root->prefix;
  do {
    if (prefix_local == (lrtr_ip_addr *)0x0) {
      root_local = (trie_node *)0x0;
LAB_0011d985:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
        __stack_chk_fail();
      }
      return root_local;
    }
    if (*(byte *)((long)&prefix_local[2].u + 0xc) <= mask_len) {
      lrtr_ip_addr_get_bits
                (&local_28,prefix_local,'\0',*(uint8_t *)((long)&prefix_local[2].u + 0xc));
      lrtr_ip_addr_get_bits(&local_40,prefix,'\0',*(uint8_t *)((long)&prefix_local[2].u + 0xc));
      a.u.addr6.addr[1] = local_28.u.addr6.addr[3];
      a._0_8_ = local_28.u._4_8_;
      a.u.addr6.addr[2] = in_stack_ffffffffffffff6c;
      a.u.addr6.addr[3] = local_40.ver;
      b.u.addr6.addr[1] = local_40.u.addr6.addr[3];
      b._0_8_ = local_40.u._4_8_;
      b.u._8_8_ = in_stack_ffffffffffffff84;
      _Var1 = lrtr_ip_addr_equal(a,b);
      if (_Var1) {
        root_local = (trie_node *)prefix_local;
        goto LAB_0011d985;
      }
    }
    _Var1 = is_left_child(prefix,*lvl);
    if (_Var1) {
      prefix_local = *(lrtr_ip_addr **)((long)&prefix_local[1].u + 8);
    }
    else {
      prefix_local = *(lrtr_ip_addr **)&prefix_local[1].u;
    }
    *lvl = *lvl + 1;
  } while( true );
}

Assistant:

struct trie_node *trie_lookup(const struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      unsigned int *lvl)
{
	while (root) {
		if (root->len <= mask_len && lrtr_ip_addr_equal(lrtr_ip_addr_get_bits(&root->prefix, 0, root->len),
								lrtr_ip_addr_get_bits(prefix, 0, root->len)))
			return (struct trie_node *)root;

		if (is_left_child(prefix, *lvl))
			root = root->lchild;
		else
			root = root->rchild;

		(*lvl)++;
	}
	return NULL;
}